

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_quantize_sse2.c
# Opt level: O0

void av1_quantize_fp_sse2
               (tran_low_t *coeff_ptr,intptr_t n_coeffs,int16_t *zbin_ptr,int16_t *round_ptr,
               int16_t *quant_ptr,int16_t *quant_shift_ptr,tran_low_t *qcoeff_ptr,
               tran_low_t *dqcoeff_ptr,int16_t *dequant_ptr,uint16_t *eob_ptr,int16_t *scan_ptr,
               int16_t *iscan_ptr)

{
  undefined1 auVar1 [12];
  undefined1 auVar2 [12];
  undefined1 auVar3 [12];
  undefined1 auVar4 [16];
  undefined8 *in_RCX;
  long in_RSI;
  undefined8 *in_R8;
  undefined1 auVar5 [16];
  undefined8 in_XMM1_Qa;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 (*in_stack_00000018) [16];
  ushort *in_stack_00000020;
  long in_stack_00000030;
  __m128i eob_shuffled;
  __m128i eob;
  __m128i thr1;
  __m128i thr0;
  __m128i dequant1;
  __m128i dequant0;
  __m128i quant1;
  __m128i quant0;
  __m128i round1;
  __m128i round0;
  __m128i *in_stack_00000380;
  __m128i *in_stack_00000388;
  __m128i *in_stack_00000390;
  __m128i *in_stack_00000398;
  __m128i *in_stack_000003a0;
  __m128i *in_stack_000003a8;
  __m128i *in_stack_000003b0;
  __m128i *in_stack_000003b8;
  undefined8 local_1e8;
  undefined4 uStack_1cc;
  undefined4 uStack_1ac;
  undefined4 local_1a8;
  undefined4 uStack_18c;
  undefined4 uStack_188;
  long local_160;
  undefined4 uStack_130;
  undefined4 uStack_124;
  undefined4 uStack_110;
  undefined4 uStack_104;
  __m128i *round0_00;
  undefined4 in_stack_ffffffffffffff10;
  tran_low_t *qcoeff_ptr_00;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff2c;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 uVar10;
  short sStack_86;
  short local_68;
  short sStack_66;
  short sStack_64;
  short sStack_62;
  short sStack_60;
  short sStack_5e;
  short sStack_5c;
  short sStack_5a;
  undefined4 uVar9;
  
  in_stack_00000030 = in_stack_00000030 + in_RSI * 2;
  local_160 = -in_RSI;
  uStack_18c = (undefined4)((ulong)in_RCX[1] >> 0x20);
  uVar9 = (undefined4)((ulong)*in_RCX >> 0x20);
  qcoeff_ptr_00 = (tran_low_t *)CONCAT44(uVar9,uStack_188);
  auVar1._4_8_ = in_XMM1_Qa;
  auVar1._0_4_ = uVar9;
  auVar6._0_8_ = auVar1._0_8_ << 0x20;
  auVar6._8_4_ = in_stack_ffffffffffffff10;
  auVar6._12_4_ = uStack_18c;
  uStack_1ac = (undefined4)((ulong)in_R8[1] >> 0x20);
  round0_00 = (__m128i *)CONCAT44(uVar9,local_1a8);
  uStack_104 = (undefined4)((ulong)*in_R8 >> 0x20);
  auVar2._4_8_ = auVar6._8_8_;
  auVar2._0_4_ = uStack_104;
  auVar7._0_8_ = auVar2._0_8_ << 0x20;
  auVar7._8_4_ = uStack_110;
  auVar7._12_4_ = uStack_1ac;
  uStack_1cc = (undefined4)((ulong)*(undefined8 *)(*in_stack_00000018 + 8) >> 0x20);
  uStack_124 = (undefined4)((ulong)*(undefined8 *)*in_stack_00000018 >> 0x20);
  auVar3._4_8_ = auVar7._8_8_;
  auVar3._0_4_ = uStack_124;
  auVar8._0_8_ = auVar3._0_8_ << 0x20;
  auVar8._8_4_ = uStack_130;
  auVar8._12_4_ = uStack_1cc;
  psraw(*in_stack_00000018,ZEXT416(1));
  uVar10 = 1;
  auVar5._8_8_ = auVar8._8_8_;
  auVar5._0_8_ = local_1e8;
  psraw(auVar5,ZEXT416(1));
  uVar9 = uStack_18c;
  quantize((int16_t *)CONCAT44(1,in_stack_ffffffffffffff30),
           (tran_low_t *)CONCAT44(in_stack_ffffffffffffff2c,uStack_188),
           CONCAT44(uStack_18c,in_stack_ffffffffffffff20),qcoeff_ptr_00,
           (tran_low_t *)CONCAT44(uStack_18c,in_stack_ffffffffffffff10),round0_00,in_stack_00000380,
           in_stack_00000388,in_stack_00000390,in_stack_00000398,in_stack_000003a0,in_stack_000003a8
           ,in_stack_000003b0,in_stack_000003b8);
  while (local_160 = local_160 + 0x10, local_160 < 0) {
    quantize((int16_t *)CONCAT44(uVar10,in_stack_ffffffffffffff30),
             (tran_low_t *)CONCAT44(in_stack_ffffffffffffff2c,uStack_188),
             CONCAT44(uVar9,in_stack_ffffffffffffff20),qcoeff_ptr_00,
             (tran_low_t *)CONCAT44(uStack_18c,in_stack_ffffffffffffff10),round0_00,
             in_stack_00000380,in_stack_00000388,in_stack_00000390,in_stack_00000398,
             in_stack_000003a0,in_stack_000003a8,in_stack_000003b0,in_stack_000003b8);
  }
  auVar5 = pshuflw(ZEXT416(0),ZEXT416(0),0xe);
  local_68 = auVar5._0_2_;
  sStack_66 = auVar5._2_2_;
  sStack_64 = auVar5._4_2_;
  sStack_62 = auVar5._6_2_;
  sStack_60 = auVar5._8_2_;
  sStack_5e = auVar5._10_2_;
  sStack_5c = auVar5._12_2_;
  sStack_5a = auVar5._14_2_;
  sStack_66 = (ushort)(0 < sStack_66) * sStack_66;
  auVar4._2_2_ = sStack_66;
  auVar4._0_2_ = (ushort)(0 < local_68) * local_68;
  auVar4._4_2_ = (ushort)(0 < sStack_64) * sStack_64;
  auVar4._6_2_ = (ushort)(0 < sStack_62) * sStack_62;
  auVar4._8_2_ = (ushort)(0 < sStack_60) * sStack_60;
  auVar4._10_2_ = (ushort)(0 < sStack_5e) * sStack_5e;
  auVar4._12_2_ = (ushort)(0 < sStack_5c) * sStack_5c;
  auVar4._14_2_ = (ushort)(0 < sStack_5a) * sStack_5a;
  auVar5 = pshuflw(auVar4,auVar4,1);
  sStack_86 = auVar5._2_2_;
  *in_stack_00000020 =
       (ushort)(sStack_66 < sStack_86) * sStack_86 | (ushort)(sStack_66 >= sStack_86) * sStack_66;
  return;
}

Assistant:

void av1_quantize_fp_sse2(const tran_low_t *coeff_ptr, intptr_t n_coeffs,
                          const int16_t *zbin_ptr, const int16_t *round_ptr,
                          const int16_t *quant_ptr,
                          const int16_t *quant_shift_ptr,
                          tran_low_t *qcoeff_ptr, tran_low_t *dqcoeff_ptr,
                          const int16_t *dequant_ptr, uint16_t *eob_ptr,
                          const int16_t *scan_ptr, const int16_t *iscan_ptr) {
  (void)scan_ptr;
  (void)zbin_ptr;
  (void)quant_shift_ptr;

  coeff_ptr += n_coeffs;
  iscan_ptr += n_coeffs;
  qcoeff_ptr += n_coeffs;
  dqcoeff_ptr += n_coeffs;
  n_coeffs = -n_coeffs;

  const __m128i round0 = _mm_load_si128((const __m128i *)round_ptr);
  const __m128i round1 = _mm_unpackhi_epi64(round0, round0);
  const __m128i quant0 = _mm_load_si128((const __m128i *)quant_ptr);
  const __m128i quant1 = _mm_unpackhi_epi64(quant0, quant0);
  const __m128i dequant0 = _mm_load_si128((const __m128i *)dequant_ptr);
  const __m128i dequant1 = _mm_unpackhi_epi64(dequant0, dequant0);
  const __m128i thr0 = _mm_srai_epi16(dequant0, 1);
  const __m128i thr1 = _mm_srai_epi16(dequant1, 1);
  __m128i eob = _mm_setzero_si128();

  quantize(iscan_ptr, coeff_ptr, n_coeffs, qcoeff_ptr, dqcoeff_ptr, &round0,
           &round1, &quant0, &quant1, &dequant0, &dequant1, &thr0, &thr1, &eob);

  n_coeffs += 8 * 2;

  // AC only loop
  while (n_coeffs < 0) {
    quantize(iscan_ptr, coeff_ptr, n_coeffs, qcoeff_ptr, dqcoeff_ptr, &round1,
             &round1, &quant1, &quant1, &dequant1, &dequant1, &thr1, &thr1,
             &eob);
    n_coeffs += 8 * 2;
  }

  // Accumulate EOB
  {
    __m128i eob_shuffled;
    eob_shuffled = _mm_shuffle_epi32(eob, 0xe);
    eob = _mm_max_epi16(eob, eob_shuffled);
    eob_shuffled = _mm_shufflelo_epi16(eob, 0xe);
    eob = _mm_max_epi16(eob, eob_shuffled);
    eob_shuffled = _mm_shufflelo_epi16(eob, 0x1);
    eob = _mm_max_epi16(eob, eob_shuffled);
    *eob_ptr = _mm_extract_epi16(eob, 1);
  }
}